

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O0

void __thiscall ObserverManager_SharedPtr_Test::TestBody(ObserverManager_SharedPtr_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  char *message;
  AssertHelper local_238;
  Message local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  AssertionResult gtest_ar;
  shared_ptr<FooBarProtocol> local_1e8;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8 [8];
  shared_ptr<B> b;
  undefined1 local_1a8 [8];
  shared_ptr<A> a;
  stringstream out;
  ObserverManager_SharedPtr_Test *this_local;
  
  this_00 = &a.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::stringstream::stringstream((stringstream *)this_00);
  std::make_shared<A,std::__cxx11::stringstream&,char_const(&)[4]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [4])this_00);
  ObserverManager::subscribe<FooBarProtocol,A>((shared_ptr<A> *)local_1a8);
  std::make_shared<B,std::__cxx11::stringstream&>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
  ObserverManager::subscribe<FooBarProtocol,B>((shared_ptr<B> *)local_1c8);
  local_1d0 = 0;
  local_1d8 = 0x11;
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::shared_ptr<FooBarProtocol>::shared_ptr<B,void>(&local_1e8,(shared_ptr<B> *)local_1c8);
  ObserverManager::unsubscribe<FooBarProtocol>(&local_1e8);
  std::shared_ptr<FooBarProtocol>::~shared_ptr(&local_1e8);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19
  ;
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Tac");
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_208,"\"Tic Tac \"","out.str()",(char (*) [9])0x1b50eb,
             &local_228);
  std::__cxx11::string::~string((string *)&local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Basic.cpp"
               ,0xb0,message);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  std::shared_ptr<B>::~shared_ptr((shared_ptr<B> *)local_1c8);
  std::shared_ptr<A>::~shared_ptr((shared_ptr<A> *)local_1a8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)&a.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(ObserverManager, SharedPtr)  {
    std::stringstream out;

    auto a = std::make_shared<A>(out, "Tic");
    ObserverManager::subscribe<FooBarProtocol>(a);

    auto b = std::make_shared<B>(out);
    ObserverManager::subscribe<FooBarProtocol>(b);
    
    ObserverManager::notify(&FooBarProtocol::foo);

    ObserverManager::unsubscribe<FooBarProtocol>(b);

    ObserverManager::notify(&FooBarProtocol::bar, "Tac");
    
    EXPECT_EQ("Tic Tac ", out.str());
}